

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void I422ToAR30Row_C(uint8_t *src_y,uint8_t *src_u,uint8_t *src_v,uint8_t *rgb_buf,
                    YuvConstants *yuvconstants,int width)

{
  long in_RCX;
  uint8_t *in_RDX;
  uint8_t *in_RSI;
  uint8_t *in_RDI;
  YuvConstants *in_R8;
  uint in_R9D;
  int r;
  int g;
  int b;
  int x;
  YuvConstants *pYVar1;
  uint8_t *in_stack_ffffffffffffffc0;
  int local_38;
  int local_34;
  int local_30;
  uint local_2c;
  YuvConstants *local_28;
  long local_20;
  uint8_t *local_18;
  uint8_t *local_10;
  uint8_t *local_8;
  
  local_2c = in_R9D;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_30 = 0; local_30 < (int)(local_2c - 1); local_30 = local_30 + 2) {
    pYVar1 = local_28;
    libyuv::YuvPixel8_16
              (*local_8,*local_10,*local_18,&local_34,&local_38,(int *)&stack0xffffffffffffffc4,
               local_28);
    libyuv::StoreAR30(in_stack_ffffffffffffffc0,(int)((ulong)pYVar1 >> 0x20),(int)pYVar1,0);
    pYVar1 = local_28;
    libyuv::YuvPixel8_16
              (local_8[1],*local_10,*local_18,&local_34,&local_38,(int *)&stack0xffffffffffffffc4,
               local_28);
    libyuv::StoreAR30(in_stack_ffffffffffffffc0,(int)((ulong)pYVar1 >> 0x20),(int)pYVar1,0);
    local_8 = local_8 + 2;
    local_10 = local_10 + 1;
    local_18 = local_18 + 1;
    local_20 = local_20 + 8;
  }
  if ((local_2c & 1) != 0) {
    libyuv::YuvPixel8_16
              (*local_8,*local_10,*local_18,&local_34,&local_38,(int *)&stack0xffffffffffffffc4,
               local_28);
    libyuv::StoreAR30(in_stack_ffffffffffffffc0,(int)((ulong)local_28 >> 0x20),(int)local_28,0);
  }
  return;
}

Assistant:

void I422ToAR30Row_C(const uint8_t* src_y,
                     const uint8_t* src_u,
                     const uint8_t* src_v,
                     uint8_t* rgb_buf,
                     const struct YuvConstants* yuvconstants,
                     int width) {
  int x;
  int b;
  int g;
  int r;
  for (x = 0; x < width - 1; x += 2) {
    YuvPixel8_16(src_y[0], src_u[0], src_v[0], &b, &g, &r, yuvconstants);
    StoreAR30(rgb_buf, b, g, r);
    YuvPixel8_16(src_y[1], src_u[0], src_v[0], &b, &g, &r, yuvconstants);
    StoreAR30(rgb_buf + 4, b, g, r);
    src_y += 2;
    src_u += 1;
    src_v += 1;
    rgb_buf += 8;  // Advance 2 pixels.
  }
  if (width & 1) {
    YuvPixel8_16(src_y[0], src_u[0], src_v[0], &b, &g, &r, yuvconstants);
    StoreAR30(rgb_buf, b, g, r);
  }
}